

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp_stress.c
# Opt level: O2

void entry(void *args0)

{
  int j;
  uint uVar1;
  int i;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  
  dVar5 = (double)*(int *)((long)args0 + 0x14);
  dVar7 = A[0] + dVar5;
  local_b0 = (double)(*(int *)((long)args0 + 0x14) * 3);
  local_a0 = A[1] + local_b0;
  dVar6 = A[2] - dVar5;
  dVar8 = A[3] - local_b0;
  dVar13 = A[4] + dVar5;
  dVar14 = A[5] + local_b0;
  local_a8 = A[6] - dVar5;
  local_88 = A[7] - local_b0;
  dVar11 = A[8] + dVar5;
  dVar12 = A[10] - dVar5;
  dVar15 = A[0xc] + dVar5;
  local_90 = A[0xe] - dVar5;
  dVar16 = A[0x10] + dVar5;
  dVar5 = A[0x12] - dVar5;
  dVar18 = A[9] + local_b0;
  dVar17 = A[0xb] - local_b0;
  dVar10 = A[0xd] + local_b0;
  dVar9 = A[0xf] - local_b0;
  local_98 = A[0x11] + local_b0;
  local_b0 = A[0x13] - local_b0;
  for (uVar2 = 0; (int)uVar2 < *(int *)((long)args0 + 0x10); uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 != 0x10; uVar1 = uVar1 + 1) {
      if ((uVar1 & 1) == 0) {
        dVar11 = local_90 * -31.0 + dVar15 * dVar12 + 1.0;
        dVar12 = (dVar12 * dVar11 - (local_90 * dVar15 + local_90 * dVar15)) + 1.0;
        dVar15 = dVar11 * 3.0 + local_90 * local_90 + -1.0;
        dVar18 = dVar11 + dVar12;
        while (24.0 < dVar12 * dVar12 + dVar11 * dVar11) {
          dVar3 = dVar12 + dVar11;
          dVar12 = (dVar11 - dVar12) * 0.05555555555555555;
          dVar11 = dVar3 * 0.058823529411764705;
        }
        local_90 = local_90 * -11.0 + (dVar18 - dVar15) + -1.0;
        while (27.0 < local_90 * local_90 + dVar15 * dVar15) {
          dVar18 = local_90 + dVar15;
          local_90 = (dVar15 - local_90) * 0.05555555555555555;
          dVar15 = dVar18 * 0.058823529411764705;
        }
        while (29.0 < local_90 * local_90 + dVar11 * dVar11) {
          dVar18 = local_90 + dVar11;
          local_90 = (dVar11 - local_90) * 0.05555555555555555;
          dVar11 = dVar18 * 0.058823529411764705;
        }
        while (31.0 < dVar15 * dVar15 + dVar12 * dVar12) {
          dVar18 = dVar15 + dVar12;
          dVar15 = (dVar12 - dVar15) * 0.05555555555555555;
          dVar12 = dVar18 * 0.058823529411764705;
        }
        dVar18 = dVar9 * -31.0 + dVar10 * dVar17 + 1.0;
        dVar17 = (dVar17 * dVar18 - (dVar9 * dVar10 + dVar9 * dVar10)) + 1.0;
        dVar10 = dVar18 * 3.0 + dVar9 * dVar9 + -1.0;
        dVar3 = dVar18 + dVar17;
        while (24.0 < dVar17 * dVar17 + dVar18 * dVar18) {
          dVar4 = dVar17 + dVar18;
          dVar17 = (dVar18 - dVar17) * 0.05555555555555555;
          dVar18 = dVar4 * 0.058823529411764705;
        }
        dVar9 = dVar9 * -11.0 + (dVar3 - dVar10) + -1.0;
        while (27.0 < dVar9 * dVar9 + dVar10 * dVar10) {
          dVar3 = dVar9 + dVar10;
          dVar9 = (dVar10 - dVar9) * 0.05555555555555555;
          dVar10 = dVar3 * 0.058823529411764705;
        }
        while (29.0 < dVar9 * dVar9 + dVar18 * dVar18) {
          dVar3 = dVar9 + dVar18;
          dVar9 = (dVar18 - dVar9) * 0.05555555555555555;
          dVar18 = dVar3 * 0.058823529411764705;
        }
        while (31.0 < dVar10 * dVar10 + dVar17 * dVar17) {
          dVar3 = dVar10 + dVar17;
          dVar10 = (dVar17 - dVar10) * 0.05555555555555555;
          dVar17 = dVar3 * 0.058823529411764705;
        }
      }
      else {
        dVar7 = local_a8 * -31.0 + dVar13 * dVar6 + 1.0;
        dVar6 = (dVar6 * dVar7 - (local_a8 * dVar13 + local_a8 * dVar13)) + 1.0;
        dVar13 = dVar7 * 3.0 + local_a8 * local_a8 + -1.0;
        dVar3 = dVar7 + dVar6;
        while (24.0 < dVar6 * dVar6 + dVar7 * dVar7) {
          dVar4 = dVar6 + dVar7;
          dVar6 = (dVar7 - dVar6) * 0.05555555555555555;
          dVar7 = dVar4 * 0.058823529411764705;
        }
        local_a8 = local_a8 * -11.0 + (dVar3 - dVar13) + -1.0;
        while (27.0 < local_a8 * local_a8 + dVar13 * dVar13) {
          dVar3 = local_a8 + dVar13;
          local_a8 = (dVar13 - local_a8) * 0.05555555555555555;
          dVar13 = dVar3 * 0.058823529411764705;
        }
        while (29.0 < local_a8 * local_a8 + dVar7 * dVar7) {
          dVar3 = local_a8 + dVar7;
          local_a8 = (dVar7 - local_a8) * 0.05555555555555555;
          dVar7 = dVar3 * 0.058823529411764705;
        }
        while (31.0 < dVar13 * dVar13 + dVar6 * dVar6) {
          dVar3 = dVar13 + dVar6;
          dVar13 = (dVar6 - dVar13) * 0.05555555555555555;
          dVar6 = dVar3 * 0.058823529411764705;
        }
        local_a0 = local_88 * -31.0 + dVar14 * dVar8 + 1.0;
        dVar8 = (dVar8 * local_a0 - (local_88 * dVar14 + local_88 * dVar14)) + 1.0;
        dVar14 = local_a0 * 3.0 + local_88 * local_88 + -1.0;
        dVar3 = local_a0 + dVar8;
        while (24.0 < dVar8 * dVar8 + local_a0 * local_a0) {
          dVar4 = dVar8 + local_a0;
          dVar8 = (local_a0 - dVar8) * 0.05555555555555555;
          local_a0 = dVar4 * 0.058823529411764705;
        }
        local_88 = local_88 * -11.0 + (dVar3 - dVar14) + -1.0;
        while (27.0 < local_88 * local_88 + dVar14 * dVar14) {
          dVar3 = local_88 + dVar14;
          local_88 = (dVar14 - local_88) * 0.05555555555555555;
          dVar14 = dVar3 * 0.058823529411764705;
        }
        while (29.0 < local_88 * local_88 + local_a0 * local_a0) {
          dVar3 = local_88 + local_a0;
          local_88 = (local_a0 - local_88) * 0.05555555555555555;
          local_a0 = dVar3 * 0.058823529411764705;
        }
        while (31.0 < dVar14 * dVar14 + dVar8 * dVar8) {
          dVar3 = dVar14 + dVar8;
          dVar14 = (dVar8 - dVar14) * 0.05555555555555555;
          dVar8 = dVar3 * 0.058823529411764705;
        }
      }
      if ((0.0 < dVar6) || (dVar17 < 0.0)) {
        dVar7 = local_98 * -31.0 + dVar16 * dVar8 + 1.0;
        dVar16 = (dVar16 * dVar7 - (dVar8 * local_98 + dVar8 * local_98)) + 1.0;
        dVar8 = dVar7 * 3.0 + local_98 * local_98 + -1.0;
        dVar15 = dVar7 + dVar16;
        while (24.0 < dVar16 * dVar16 + dVar7 * dVar7) {
          dVar3 = dVar16 + dVar7;
          dVar16 = (dVar7 - dVar16) * 0.05555555555555555;
          dVar7 = dVar3 * 0.058823529411764705;
        }
        local_98 = local_98 * -11.0 + (dVar15 - dVar8) + -1.0;
        while (27.0 < local_98 * local_98 + dVar8 * dVar8) {
          dVar15 = local_98 + dVar8;
          local_98 = (dVar8 - local_98) * 0.05555555555555555;
          dVar8 = dVar15 * 0.058823529411764705;
        }
        while (29.0 < local_98 * local_98 + dVar7 * dVar7) {
          dVar15 = local_98 + dVar7;
          local_98 = (dVar7 - local_98) * 0.05555555555555555;
          dVar7 = dVar15 * 0.058823529411764705;
        }
        while (31.0 < dVar8 * dVar8 + dVar16 * dVar16) {
          dVar15 = dVar16 + dVar8;
          dVar8 = (dVar16 - dVar8) * 0.05555555555555555;
          dVar16 = dVar15 * 0.058823529411764705;
        }
        dVar15 = local_b0 * -31.0 + dVar5 * dVar9 + 1.0;
        dVar5 = (dVar5 * dVar15 - (dVar9 * local_b0 + dVar9 * local_b0)) + 1.0;
        dVar9 = dVar15 * 3.0 + local_b0 * local_b0 + -1.0;
        dVar3 = dVar15 + dVar5;
        while (24.0 < dVar5 * dVar5 + dVar15 * dVar15) {
          dVar4 = dVar5 + dVar15;
          dVar5 = (dVar15 - dVar5) * 0.05555555555555555;
          dVar15 = dVar4 * 0.058823529411764705;
        }
        local_b0 = local_b0 * -11.0 + (dVar3 - dVar9) + -1.0;
        while (27.0 < local_b0 * local_b0 + dVar9 * dVar9) {
          dVar3 = local_b0 + dVar9;
          local_b0 = (dVar9 - local_b0) * 0.05555555555555555;
          dVar9 = dVar3 * 0.058823529411764705;
        }
        while (29.0 < local_b0 * local_b0 + dVar15 * dVar15) {
          dVar3 = local_b0 + dVar15;
          local_b0 = (dVar15 - local_b0) * 0.05555555555555555;
          dVar15 = dVar3 * 0.058823529411764705;
        }
        while (31.0 < dVar9 * dVar9 + dVar5 * dVar5) {
          dVar3 = dVar5 + dVar9;
          dVar9 = (dVar5 - dVar9) * 0.05555555555555555;
          dVar5 = dVar3 * 0.058823529411764705;
        }
      }
    }
    fiber_switch(*args0,*(Fiber **)((long)args0 + 8));
    if (uVar2 % 0x32 == 0) {
      A[1] = local_a0;
      A[6] = local_a8;
      A[7] = local_88;
      A[0xe] = local_90;
      A[0x11] = local_98;
      A[0] = dVar7;
      A[2] = dVar6;
      A[3] = dVar8;
      A[4] = dVar13;
      A[5] = dVar14;
      A[8] = dVar11;
      A[9] = dVar18;
      A[10] = dVar12;
      A[0xb] = dVar17;
      A[0xc] = dVar15;
      A[0xd] = dVar10;
      A[0xf] = dVar9;
      A[0x10] = dVar16;
      A[0x12] = dVar5;
      A[0x13] = local_b0;
      print(*(int *)((long)args0 + 0x14));
    }
  }
  A[1] = local_a0;
  A[6] = local_a8;
  A[7] = local_88;
  A[0xe] = local_90;
  A[0x11] = local_98;
  A[0] = dVar7;
  A[2] = dVar6;
  A[3] = dVar8;
  A[4] = dVar13;
  A[5] = dVar14;
  A[8] = dVar11;
  A[9] = dVar18;
  A[10] = dVar12;
  A[0xb] = dVar17;
  A[0xc] = dVar15;
  A[0xd] = dVar10;
  A[0xf] = dVar9;
  A[0x10] = dVar16;
  A[0x12] = dVar5;
  A[0x13] = local_b0;
  print(*(int *)((long)args0 + 0x14));
  *(undefined1 *)((long)args0 + 0x18) = 1;
  fiber_switch(*args0,*(Fiber **)((long)args0 + 8));
  return;
}

Assistant:

static void
entry(void *args0)
{
    Args *args = (Args *) args0;
    DEF_A(0, 1, 2, 3);
    DEF_A(4, 5, 6, 7);
    DEF_A(8, 9, 10, 11);
    DEF_A(12, 13, 14, 15);
    DEF_A(16, 17, 18, 19);

    for (int i = 0; i < args->n; ++i) {
        for (int j = 0; j < 16; ++j) {
            if (j & 1) {
                MIX(0, 2, 4, 6);
                MIX(1, 3, 5, 7);
            } else {
                MIX(8, 10, 12, 14);
                MIX(9, 11, 13, 15);
            }
            if (a2 > 0 || a11 < 0) {
                MIX(0, 16, 3, 17);
                MIX(12, 18, 15, 19);
            }
        }
        fiber_switch(args->self, args->caller);
        if (i % 50 == 0) {
            STORE_ALL;
            print(args->id);
        }
    }

    STORE_ALL;
    print(args->id);
    args->done = true;
    fiber_switch(args->self, args->caller);
}